

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O2

void upd7759_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  uint uVar2;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  upd7759_state *chip;
  
  __s = *outputs;
  __s_00 = outputs[1];
  if (*(char *)((long)param + 0x38) == '\0') {
    if (samples != 0) {
      memset(__s,0,(ulong)samples << 2);
      memset(__s_00,0,(ulong)samples << 2);
      return;
    }
  }
  else {
    for (uVar8 = 0; uVar8 != samples; uVar8 = uVar8 + 1) {
      iVar4 = 0;
      if (*(char *)((long)param + 0x80) == '\0') {
        iVar4 = (int)*(short *)((long)param + 0x5e) << 7;
      }
      __s[uVar8] = iVar4;
      __s_00[uVar8] = iVar4;
      uVar5 = *(int *)((long)param + 0x24) + *(int *)((long)param + 0x28);
      *(uint *)((long)param + 0x24) = uVar5;
      if (*(int *)((long)param + 0x58) == 0) {
        do {
          if ((*(long *)((long)param + 0x68) == 0) ||
             (uVar5 = *(uint *)((long)param + 0x24), uVar5 < 0x100000)) break;
          uVar6 = uVar5 >> 0x14;
          uVar2 = *(uint *)((long)param + 0x3c);
          uVar3 = uVar2;
          if ((int)uVar6 < (int)uVar2) {
            uVar3 = uVar6;
          }
          *(uint *)((long)param + 0x24) = uVar5 + uVar3 * -0x100000;
          *(uint *)((long)param + 0x3c) = uVar2 - uVar3;
        } while (((int)uVar6 < (int)uVar2) ||
                (advance_state((upd7759_state *)param), *(char *)((long)param + 0x38) != '\0'));
      }
      else {
        while( true ) {
          iVar4 = *(int *)((long)param + 0x3c);
          iVar7 = iVar4 - (uVar5 >> 0x14);
          if (iVar7 != 0 && (int)(uVar5 >> 0x14) <= iVar4) break;
          *(uint *)((long)param + 0x24) = uVar5 + iVar4 * -0x100000;
          *(undefined4 *)((long)param + 0x3c) = 0;
          cVar1 = *(char *)((long)param + 0x2f);
          advance_state((upd7759_state *)param);
          if ((cVar1 != *(char *)((long)param + 0x2f)) &&
             (*(code **)((long)param + 0x30) != (code *)0x0)) {
            (**(code **)((long)param + 0x30))(param);
          }
          uVar5 = *(uint *)((long)param + 0x24);
        }
        *(int *)((long)param + 0x3c) = iVar7;
        *(uint *)((long)param + 0x24) = uVar5 & 0xfffff;
      }
    }
  }
  return;
}

Assistant:

static void upd7759_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	upd7759_state *chip = (upd7759_state *)param;
	UINT32 i;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];

	/* loop until done */
	i = 0;
	if (chip->state != STATE_IDLE)
		for (; i < samples; i++)
		{
			/* store the current sample */
			INT16 sample = chip->Muted ? 0 : chip->sample;
			buffer[i] = sample << 7;
			buffer2[i] = sample << 7;

			/* advance by the number of clocks/output sample */
			chip->pos += chip->step;

			if (chip->mode == MODE_STAND_ALONE)
			{
				/* handle clocks, but only in standalone mode */
				while (chip->rom != NULL && chip->pos >= FRAC_ONE)
				{
					int clocks_this_time = chip->pos >> FRAC_BITS;
					if (clocks_this_time > chip->clocks_left)
						clocks_this_time = chip->clocks_left;

					/* clock once */
					chip->pos -= clocks_this_time * FRAC_ONE;
					chip->clocks_left -= clocks_this_time;

					/* if we're out of clocks, time to handle the next state */
					if (chip->clocks_left == 0)
					{
						/* advance one state; if we hit idle, bail */
						advance_state(chip);
						if (chip->state == STATE_IDLE)
							break;
					}
				}
			}
			else
			{
				while(chip->clocks_left <= (INT32)(chip->pos >> FRAC_BITS))
				{
					chip->pos -= chip->clocks_left << FRAC_BITS;
					chip->clocks_left = 0;
					upd7759_slave_update(chip);
				}
				chip->clocks_left -= (chip->pos >> FRAC_BITS);
				chip->pos &= FRAC_MASK;
			}
		}

	/* if we got out early, just zap the rest of the buffer */
	if (i < samples)
	{
		samples -= i;
		memset(&buffer[i], 0, samples * sizeof(DEV_SMPL));
		memset(&buffer2[i], 0, samples * sizeof(DEV_SMPL));
	}
}